

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O2

char * GGUFMeta::GKV<int>::override_type_to_str(llama_model_kv_override_type ty)

{
  if (ty < 4) {
    return *(char **)(&DAT_002ce068 + (ulong)ty * 8);
  }
  return "unknown";
}

Assistant:

static const char * override_type_to_str(const llama_model_kv_override_type ty) {
            switch (ty) {
                case LLAMA_KV_OVERRIDE_TYPE_BOOL:  return "bool";
                case LLAMA_KV_OVERRIDE_TYPE_INT:   return "int";
                case LLAMA_KV_OVERRIDE_TYPE_FLOAT: return "float";
                case LLAMA_KV_OVERRIDE_TYPE_STR:   return "str";
            }
            return "unknown";
        }